

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.cpp
# Opt level: O1

void __thiscall vera::PingPong::clear(PingPong *this,float _alpha)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    (**(code **)(*(long *)(&this->field_0x18 + lVar1) + 0x18))(&this->field_0x18 + lVar1);
    glClearColor(0,0,0,_alpha);
    glClear(0x4100);
    (**(code **)(*(long *)(&this->field_0x18 + lVar1) + 0x20))(&this->field_0x18 + lVar1);
    lVar1 = lVar1 + 0x38;
  } while (lVar1 == 0x38);
  return;
}

Assistant:

void PingPong::clear(float _alpha) {
    for(int i = 0; i < 2; i++){
        m_fbos[i].bind();
        glClearColor(0.0f, 0.0f, 0.0f, _alpha);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        m_fbos[i].unbind();
    }
}